

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHServerConfigsWithoutRetryConfigs_Test::TestBody
          (SSLTest_ECHServerConfigsWithoutRetryConfigs_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ech_config_len_00;
  size_t ech_config_00;
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *peVar3;
  EVP_HPKE_KEM *kem;
  char *pcVar4;
  char *pcVar5;
  SSL_ECH_KEYS *__p;
  pointer psVar6;
  SSL_METHOD *meth;
  pointer psVar7;
  char *in_R9;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  int local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_288;
  Message local_280;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL_CTX> ctx;
  AssertHelper local_1b0;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  size_t ech_config_len;
  uint8_t *ech_config;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  SSLTest_ECHServerConfigsWithoutRetryConfigs_Test *this_local;
  
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  peVar3 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  local_94 = EVP_HPKE_KEY_generate(peVar3,kem);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_90,&local_94,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x7ff,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  ech_config._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (ech_config._4_4_ == 0) {
    peVar3 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar_.message_);
    pcVar4 = (char *)0x10;
    local_104 = SSL_marshal_ech_config
                          ((uint8_t **)&ech_config_len,(size_t *)&gtest_ar__1.message_,'\x01',peVar3
                           ,"public.example",0x10);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_100,&local_104,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&free_ech_config,(internal *)local_100,
                 (AssertionResult *)
                 "SSL_marshal_ech_config(&ech_config, &ech_config_len, 1, key.get(), \"public.example\", 16)"
                 ,"false","true",pcVar4);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x804,pcVar5);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&free_ech_config);
      testing::Message::~Message(&local_110);
    }
    ech_config._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (ech_config._4_4_ == 0) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&keys,(pointer)ech_config_len)
      ;
      __p = SSL_ECH_KEYS_new();
      std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,__p);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_158,
                 (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_158,(AssertionResult *)0x4dabc5
                   ,"false","true",pcVar4);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x809,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_160);
      }
      ech_config._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      if (ech_config._4_4_ == 0) {
        psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                            &gtest_ar__2.message_);
        ech_config_00 = ech_config_len;
        ech_config_len_00 = gtest_ar__1.message_;
        peVar3 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar_.message_);
        local_19c = SSL_ECH_KEYS_add(psVar6,0,(uint8_t *)ech_config_00,
                                     (size_t)ech_config_len_00._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl,peVar3);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_198,&local_19c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
        if (!bVar1) {
          testing::Message::Message(&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ctx,(internal *)local_198,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 0, ech_config, ech_config_len, key.get())",
                     "false","true",pcVar4);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x80b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b0);
          std::__cxx11::string::~string((string *)&ctx);
          testing::Message::~Message(&local_1a8);
        }
        ech_config._4_4_ = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
        if (ech_config._4_4_ == 0) {
          meth = (SSL_METHOD *)TLS_method();
          psVar7 = (pointer)SSL_CTX_new(meth);
          std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,psVar7)
          ;
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_1e8,
                     (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar1) {
            testing::Message::Message(&local_1f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_1e8,
                       (AssertionResult *)0x4d86cd,"false","true",pcVar4);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x80f,pcVar5);
            testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
            testing::internal::AssertHelper::~AssertHelper(&local_1f8);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_1f0);
          }
          ech_config._4_4_ = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          if (ech_config._4_4_ == 0) {
            psVar7 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            iVar2 = SSL_CTX_set1_ech_keys(psVar7,psVar6);
            local_229 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_228,&local_229,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
            if (!bVar1) {
              testing::Message::Message(&local_238);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_228,
                         (AssertionResult *)"SSL_CTX_set1_ech_keys(ctx.get(), keys.get())","true",
                         "false",pcVar4);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_240,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x810,pcVar5);
              testing::internal::AssertHelper::operator=(&local_240,&local_238);
              testing::internal::AssertHelper::~AssertHelper(&local_240);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_238);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
            psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            peVar3 = internal::
                     StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                     ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                            *)&gtest_ar_.message_);
            local_274 = SSL_ECH_KEYS_add(psVar6,1,(uint8_t *)ech_config_len,
                                         (size_t)gtest_ar__1.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl,peVar3);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_270,&local_274,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
            if (!bVar1) {
              testing::Message::Message(&local_280);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__7.message_,(internal *)local_270,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config, ech_config_len, key.get())",
                         "false","true",pcVar4);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_288,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x815,pcVar5);
              testing::internal::AssertHelper::operator=(&local_288,&local_280);
              testing::internal::AssertHelper::~AssertHelper(&local_288);
              std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
              testing::Message::~Message(&local_280);
            }
            ech_config._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
            if (ech_config._4_4_ == 0) {
              psVar7 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__4.message_);
              psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              local_2bc = SSL_CTX_set1_ech_keys(psVar7,psVar6);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_2b8,&local_2bc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
              if (!bVar1) {
                testing::Message::Message(&local_2c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_2f0,(internal *)local_2b8,
                           (AssertionResult *)"SSL_CTX_set1_ech_keys(ctx.get(), keys.get())","false"
                           ,"true",pcVar4);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x816,pcVar4);
                testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
                testing::internal::AssertHelper::~AssertHelper(&local_2d0);
                std::__cxx11::string::~string((string *)&local_2f0);
                testing::Message::~Message(&local_2c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
              ech_config._4_4_ = 0;
            }
          }
          std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&keys);
    }
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHServerConfigsWithoutRetryConfigs) {
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config;
  size_t ech_config_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config, &ech_config_len,
                                     /*config_id=*/1, key.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  // Install a non-retry config.
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/0, ech_config,
                               ech_config_len, key.get()));

  // |keys| has no retry configs.
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  EXPECT_FALSE(SSL_CTX_set1_ech_keys(ctx.get(), keys.get()));

  // Add the same ECHConfig to the list, but this time mark it as a retry
  // config.
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                               ech_config_len, key.get()));
  EXPECT_TRUE(SSL_CTX_set1_ech_keys(ctx.get(), keys.get()));
}